

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS ref_fixture_twod_square_circle(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  double dVar3;
  long local_1640;
  REF_INT local_1630;
  long local_1628;
  long local_1608;
  long local_15b8;
  REF_INT local_15a8;
  long local_15a0;
  long local_1580;
  long local_1530;
  REF_INT local_1520;
  long local_1518;
  long local_14f8;
  long local_14a8;
  REF_INT local_1498;
  long local_1490;
  long local_1470;
  int local_142c;
  int local_1400;
  int local_13d4;
  int local_13a8;
  long local_1370;
  REF_INT local_1360;
  long local_1358;
  long local_1338;
  long local_12e8;
  REF_INT local_12d8;
  long local_12d0;
  long local_12b0;
  long local_1260;
  REF_INT local_1250;
  long local_1248;
  long local_1228;
  long local_11d8;
  REF_INT local_11c8;
  long local_11c0;
  long local_11a0;
  int local_115c;
  int local_1130;
  int local_1104;
  int local_10d8;
  long local_10a0;
  REF_INT local_1090;
  long local_1088;
  long local_1068;
  long local_1018;
  REF_INT local_1008;
  long local_1000;
  long local_fe0;
  long local_f90;
  REF_INT local_f80;
  long local_f78;
  long local_f58;
  long local_f08;
  REF_INT local_ef8;
  long local_ef0;
  long local_ed0;
  int local_e8c;
  int local_e60;
  int local_e34;
  int local_e08;
  long local_dd0;
  REF_INT local_dc0;
  long local_db8;
  long local_d98;
  long local_d48;
  REF_INT local_d38;
  long local_d30;
  long local_d10;
  long local_cc0;
  REF_INT local_cb0;
  long local_ca8;
  long local_c88;
  long local_c38;
  REF_INT local_c28;
  long local_c20;
  long local_c00;
  int local_bbc;
  int local_b90;
  int local_b64;
  int local_b38;
  long local_b00;
  REF_INT local_af0;
  long local_ae8;
  long local_ac8;
  long local_a98;
  REF_INT local_a88;
  long local_a80;
  long local_a60;
  long local_a30;
  REF_INT local_a20;
  long local_a18;
  long local_9f8;
  long local_9c8;
  REF_INT local_9b8;
  long local_9b0;
  long local_990;
  int local_96c;
  int local_940;
  int local_914;
  int local_8e8;
  long local_8b0;
  REF_INT local_8a0;
  long local_898;
  long local_878;
  long local_848;
  REF_INT local_838;
  long local_830;
  long local_810;
  long local_7e0;
  REF_INT local_7d0;
  long local_7c8;
  long local_7a8;
  long local_778;
  REF_INT local_768;
  long local_760;
  long local_740;
  int local_71c;
  int local_6f0;
  int local_6c4;
  int local_698;
  long local_660;
  REF_INT local_650;
  long local_648;
  long local_628;
  long local_5f8;
  REF_INT local_5e8;
  long local_5e0;
  long local_5c0;
  long local_590;
  REF_INT local_580;
  long local_578;
  long local_558;
  long local_528;
  REF_INT local_518;
  long local_510;
  long local_4f0;
  int local_4cc;
  int local_4a0;
  int local_474;
  int local_448;
  long local_410;
  REF_INT local_400;
  long local_3f8;
  long local_3d8;
  long local_3a8;
  REF_INT local_398;
  long local_390;
  long local_370;
  long local_340;
  REF_INT local_330;
  long local_328;
  long local_308;
  long local_2d8;
  REF_INT local_2c8;
  long local_2c0;
  long local_2a0;
  int local_280;
  int local_254;
  int local_228;
  int local_1fc;
  REF_STATUS ref_private_macro_code_rss_41;
  REF_STATUS ref_private_macro_code_rss_40;
  REF_STATUS ref_private_macro_code_rss_39;
  REF_STATUS ref_private_macro_code_rss_38;
  REF_STATUS ref_private_macro_code_rss_37;
  REF_STATUS ref_private_macro_code_rss_36;
  REF_STATUS ref_private_macro_code_rss_35;
  REF_STATUS ref_private_macro_code_rss_34;
  REF_STATUS ref_private_macro_code_rss_33;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL t;
  REF_DBL r;
  REF_DBL y0;
  REF_DBL x0;
  REF_INT nnodesg;
  REF_INT cell;
  REF_INT local [27];
  REF_INT global [27];
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  x0._0_4_ = 0x18;
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x810
           ,"ref_fixture_twod_square_circle",(ulong)uVar2,"create");
    return uVar2;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node_00 = pRVar1->node;
  pRVar1->twod = 1;
  local[0x1a] = 0;
  local[2] = 1;
  if (0 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
      x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
    local_1fc = 0 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_1fc = -((x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                 ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n) +
                (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
  }
  if (ref_mpi->id == local_1fc) {
LAB_001451ba:
    uVar2 = ref_node_add(ref_node_00,0,&nnodesg);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x823,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[nnodesg * 0xf] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 1] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_2a0 = -1;
    }
    else {
      local_2a0 = ref_node_00->global[nnodesg];
    }
    if (local_2a0 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_2c0 = -1;
      }
      else {
        local_2c0 = ref_node_00->global[nnodesg];
      }
      local_2c8 = (REF_INT)(local_2c0 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_2d8 = -1;
      }
      else {
        local_2d8 = ref_node_00->global[nnodesg];
      }
      local_2c8 = (int)((local_2d8 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[nnodesg] = local_2c8;
    uVar2 = ref_node_add(ref_node_00,1,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x824,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[cell * 0xf] = 0.3333333333333333;
    ref_node_00->real[cell * 0xf + 1] = 0.0;
    ref_node_00->real[cell * 0xf + 2] = 0.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_308 = -1;
    }
    else {
      local_308 = ref_node_00->global[cell];
    }
    if (local_308 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_328 = -1;
      }
      else {
        local_328 = ref_node_00->global[cell];
      }
      local_330 = (REF_INT)(local_328 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_340 = -1;
      }
      else {
        local_340 = ref_node_00->global[cell];
      }
      local_330 = (int)((local_340 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[cell] = local_330;
    uVar2 = ref_node_add(ref_node_00,2,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x825,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[0] * 0xf] = 0.6666666666666666;
    ref_node_00->real[local[0] * 0xf + 1] = 0.0;
    ref_node_00->real[local[0] * 0xf + 2] = 0.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_370 = -1;
    }
    else {
      local_370 = ref_node_00->global[local[0]];
    }
    if (local_370 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_390 = -1;
      }
      else {
        local_390 = ref_node_00->global[local[0]];
      }
      local_398 = (REF_INT)(local_390 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_3a8 = -1;
      }
      else {
        local_3a8 = ref_node_00->global[local[0]];
      }
      local_398 = (int)((local_3a8 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_398;
    uVar2 = ref_node_add(ref_node_00,3,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x826,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[1] * 0xf] = 1.0;
    ref_node_00->real[local[1] * 0xf + 1] = 0.0;
    ref_node_00->real[local[1] * 0xf + 2] = 0.0;
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_3d8 = -1;
    }
    else {
      local_3d8 = ref_node_00->global[local[1]];
    }
    if (local_3d8 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_3f8 = -1;
      }
      else {
        local_3f8 = ref_node_00->global[local[1]];
      }
      local_400 = (REF_INT)(local_3f8 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_410 = -1;
      }
      else {
        local_410 = ref_node_00->global[local[1]];
      }
      local_400 = (int)((local_410 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[1]] = local_400;
    uVar2 = ref_cell_add(pRVar1->cell[2],&nnodesg,(REF_INT *)((long)&x0 + 4));
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x828,"ref_fixture_twod_square_circle",(ulong)uVar2,"add tri");
      return uVar2;
    }
  }
  else {
    if (1 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_228 = 1 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_228 = (1 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                       ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n)
                  + (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_228) goto LAB_001451ba;
    if (2 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_254 = 2 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_254 = (2 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                       ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n)
                  + (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_254) goto LAB_001451ba;
    if (3 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_280 = 3 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_280 = (3 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                       ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n)
                  + (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_280) goto LAB_001451ba;
  }
  local[0x1a] = 3;
  local[2] = 2;
  if (3 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
      x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
    local_448 = 3 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_448 = (3 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                     ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n) +
                (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
  }
  if (ref_mpi->id == local_448) {
LAB_00146675:
    uVar2 = ref_node_add(ref_node_00,3,&nnodesg);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x838,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[nnodesg * 0xf] = 1.0;
    ref_node_00->real[nnodesg * 0xf + 1] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_4f0 = -1;
    }
    else {
      local_4f0 = ref_node_00->global[nnodesg];
    }
    if (local_4f0 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_510 = -1;
      }
      else {
        local_510 = ref_node_00->global[nnodesg];
      }
      local_518 = (REF_INT)(local_510 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_528 = -1;
      }
      else {
        local_528 = ref_node_00->global[nnodesg];
      }
      local_518 = (int)((local_528 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[nnodesg] = local_518;
    uVar2 = ref_node_add(ref_node_00,4,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x839,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[cell * 0xf] = 1.0;
    ref_node_00->real[cell * 0xf + 1] = 0.3333333333333333;
    ref_node_00->real[cell * 0xf + 2] = 0.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_558 = -1;
    }
    else {
      local_558 = ref_node_00->global[cell];
    }
    if (local_558 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_578 = -1;
      }
      else {
        local_578 = ref_node_00->global[cell];
      }
      local_580 = (REF_INT)(local_578 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_590 = -1;
      }
      else {
        local_590 = ref_node_00->global[cell];
      }
      local_580 = (int)((local_590 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[cell] = local_580;
    uVar2 = ref_node_add(ref_node_00,5,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x83a,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[0] * 0xf] = 1.0;
    ref_node_00->real[local[0] * 0xf + 1] = 0.6666666666666666;
    ref_node_00->real[local[0] * 0xf + 2] = 0.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_5c0 = -1;
    }
    else {
      local_5c0 = ref_node_00->global[local[0]];
    }
    if (local_5c0 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_5e0 = -1;
      }
      else {
        local_5e0 = ref_node_00->global[local[0]];
      }
      local_5e8 = (REF_INT)(local_5e0 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_5f8 = -1;
      }
      else {
        local_5f8 = ref_node_00->global[local[0]];
      }
      local_5e8 = (int)((local_5f8 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_5e8;
    uVar2 = ref_node_add(ref_node_00,6,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x83b,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[1] * 0xf] = 1.0;
    ref_node_00->real[local[1] * 0xf + 1] = 1.0;
    ref_node_00->real[local[1] * 0xf + 2] = 0.0;
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_628 = -1;
    }
    else {
      local_628 = ref_node_00->global[local[1]];
    }
    if (local_628 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_648 = -1;
      }
      else {
        local_648 = ref_node_00->global[local[1]];
      }
      local_650 = (REF_INT)(local_648 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_660 = -1;
      }
      else {
        local_660 = ref_node_00->global[local[1]];
      }
      local_650 = (int)((local_660 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[1]] = local_650;
    uVar2 = ref_cell_add(pRVar1->cell[2],&nnodesg,(REF_INT *)((long)&x0 + 4));
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x83d,"ref_fixture_twod_square_circle",(ulong)uVar2,"add tri");
      return uVar2;
    }
  }
  else {
    if (4 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_474 = 4 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_474 = (4 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                       ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n)
                  + (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_474) goto LAB_00146675;
    if (5 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_4a0 = 5 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_4a0 = (5 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                       ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n)
                  + (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_4a0) goto LAB_00146675;
    if (6 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_4cc = 6 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_4cc = (6 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                       ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n)
                  + (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_4cc) goto LAB_00146675;
  }
  local[0x1a] = 6;
  local[2] = 3;
  if (6 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
      x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
    local_698 = 6 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_698 = (6 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                     ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n) +
                (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
  }
  if (ref_mpi->id == local_698) {
LAB_00147b44:
    uVar2 = ref_node_add(ref_node_00,6,&nnodesg);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x84d,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[nnodesg * 0xf] = 1.0;
    ref_node_00->real[nnodesg * 0xf + 1] = 1.0;
    ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_740 = -1;
    }
    else {
      local_740 = ref_node_00->global[nnodesg];
    }
    if (local_740 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_760 = -1;
      }
      else {
        local_760 = ref_node_00->global[nnodesg];
      }
      local_768 = (REF_INT)(local_760 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_778 = -1;
      }
      else {
        local_778 = ref_node_00->global[nnodesg];
      }
      local_768 = (int)((local_778 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[nnodesg] = local_768;
    uVar2 = ref_node_add(ref_node_00,7,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x84e,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[cell * 0xf] = 0.6666666666666666;
    ref_node_00->real[cell * 0xf + 1] = 1.0;
    ref_node_00->real[cell * 0xf + 2] = 0.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_7a8 = -1;
    }
    else {
      local_7a8 = ref_node_00->global[cell];
    }
    if (local_7a8 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_7c8 = -1;
      }
      else {
        local_7c8 = ref_node_00->global[cell];
      }
      local_7d0 = (REF_INT)(local_7c8 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_7e0 = -1;
      }
      else {
        local_7e0 = ref_node_00->global[cell];
      }
      local_7d0 = (int)((local_7e0 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[cell] = local_7d0;
    uVar2 = ref_node_add(ref_node_00,8,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x84f,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[0] * 0xf] = 0.3333333333333333;
    ref_node_00->real[local[0] * 0xf + 1] = 1.0;
    ref_node_00->real[local[0] * 0xf + 2] = 0.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_810 = -1;
    }
    else {
      local_810 = ref_node_00->global[local[0]];
    }
    if (local_810 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_830 = -1;
      }
      else {
        local_830 = ref_node_00->global[local[0]];
      }
      local_838 = (REF_INT)(local_830 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_848 = -1;
      }
      else {
        local_848 = ref_node_00->global[local[0]];
      }
      local_838 = (int)((local_848 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_838;
    uVar2 = ref_node_add(ref_node_00,9,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x850,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[1] * 0xf] = 0.0;
    ref_node_00->real[local[1] * 0xf + 1] = 1.0;
    ref_node_00->real[local[1] * 0xf + 2] = 0.0;
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_878 = -1;
    }
    else {
      local_878 = ref_node_00->global[local[1]];
    }
    if (local_878 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_898 = -1;
      }
      else {
        local_898 = ref_node_00->global[local[1]];
      }
      local_8a0 = (REF_INT)(local_898 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_8b0 = -1;
      }
      else {
        local_8b0 = ref_node_00->global[local[1]];
      }
      local_8a0 = (int)((local_8b0 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[1]] = local_8a0;
    uVar2 = ref_cell_add(pRVar1->cell[2],&nnodesg,(REF_INT *)((long)&x0 + 4));
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x852,"ref_fixture_twod_square_circle",(ulong)uVar2,"add tri");
      return uVar2;
    }
  }
  else {
    if (7 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_6c4 = 7 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_6c4 = (7 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                       ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n)
                  + (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_6c4) goto LAB_00147b44;
    if (8 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_6f0 = 8 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_6f0 = (8 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                       ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n)
                  + (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_6f0) goto LAB_00147b44;
    if (9 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_71c = 9 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_71c = (9 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                       ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n)
                  + (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_71c) goto LAB_00147b44;
  }
  local[0x1a] = 9;
  local[2] = 4;
  if (9 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
      x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
    local_8e8 = 9 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_8e8 = (9 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                     ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n) +
                (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
  }
  if (ref_mpi->id == local_8e8) {
LAB_00149013:
    uVar2 = ref_node_add(ref_node_00,9,&nnodesg);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x862,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[nnodesg * 0xf] = 0.0;
    ref_node_00->real[nnodesg * 0xf + 1] = 1.0;
    ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_990 = -1;
    }
    else {
      local_990 = ref_node_00->global[nnodesg];
    }
    if (local_990 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_9b0 = -1;
      }
      else {
        local_9b0 = ref_node_00->global[nnodesg];
      }
      local_9b8 = (REF_INT)(local_9b0 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_9c8 = -1;
      }
      else {
        local_9c8 = ref_node_00->global[nnodesg];
      }
      local_9b8 = (int)((local_9c8 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[nnodesg] = local_9b8;
    uVar2 = ref_node_add(ref_node_00,10,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x863,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[cell * 0xf] = 0.0;
    ref_node_00->real[cell * 0xf + 1] = 0.6666666666666666;
    ref_node_00->real[cell * 0xf + 2] = 0.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_9f8 = -1;
    }
    else {
      local_9f8 = ref_node_00->global[cell];
    }
    if (local_9f8 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_a18 = -1;
      }
      else {
        local_a18 = ref_node_00->global[cell];
      }
      local_a20 = (REF_INT)(local_a18 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_a30 = -1;
      }
      else {
        local_a30 = ref_node_00->global[cell];
      }
      local_a20 = (int)((local_a30 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[cell] = local_a20;
    uVar2 = ref_node_add(ref_node_00,0xb,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x864,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[0] * 0xf] = 0.0;
    ref_node_00->real[local[0] * 0xf + 1] = 0.3333333333333333;
    ref_node_00->real[local[0] * 0xf + 2] = 0.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_a60 = -1;
    }
    else {
      local_a60 = ref_node_00->global[local[0]];
    }
    if (local_a60 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_a80 = -1;
      }
      else {
        local_a80 = ref_node_00->global[local[0]];
      }
      local_a88 = (REF_INT)(local_a80 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_a98 = -1;
      }
      else {
        local_a98 = ref_node_00->global[local[0]];
      }
      local_a88 = (int)((local_a98 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_a88;
    uVar2 = ref_node_add(ref_node_00,0,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x865,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    ref_node_00->real[local[1] * 0xf] = 0.0;
    ref_node_00->real[local[1] * 0xf + 1] = 0.0;
    ref_node_00->real[local[1] * 0xf + 2] = 0.0;
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_ac8 = -1;
    }
    else {
      local_ac8 = ref_node_00->global[local[1]];
    }
    if (local_ac8 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_ae8 = -1;
      }
      else {
        local_ae8 = ref_node_00->global[local[1]];
      }
      local_af0 = (REF_INT)(local_ae8 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_b00 = -1;
      }
      else {
        local_b00 = ref_node_00->global[local[1]];
      }
      local_af0 = (int)((local_b00 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[1]] = local_af0;
    uVar2 = ref_cell_add(pRVar1->cell[2],&nnodesg,(REF_INT *)((long)&x0 + 4));
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x867,"ref_fixture_twod_square_circle",(ulong)uVar2,"add tri");
      return uVar2;
    }
  }
  else {
    if (10 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_914 = 10 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_914 = (10 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((x0._0_4_ + -1) / ref_mpi->n) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_914) goto LAB_00149013;
    if (0xb / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_940 = 0xb / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_940 = (0xb - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                         ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((x0._0_4_ + -1) / ref_mpi->n) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_940) goto LAB_00149013;
    if (0 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_96c = 0 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_96c = -((x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                   ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_96c) goto LAB_00149013;
  }
  local[0x1a] = 0xc;
  local[2] = 5;
  if (0xc / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
      x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
    local_b38 = 0xc / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_b38 = (0xc - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                       ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n)
                + (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
  }
  if (ref_mpi->id == local_b38) {
LAB_0014a4ce:
    uVar2 = ref_node_add(ref_node_00,0xc,&nnodesg);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x878,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    dVar3 = cos(6.28318530717958);
    ref_node_00->real[nnodesg * 0xf] = dVar3 * 0.25 + 0.5;
    dVar3 = sin(6.28318530717958);
    ref_node_00->real[nnodesg * 0xf + 1] = dVar3 * 0.25 + 0.5;
    ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_c00 = -1;
    }
    else {
      local_c00 = ref_node_00->global[nnodesg];
    }
    if (local_c00 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_c20 = -1;
      }
      else {
        local_c20 = ref_node_00->global[nnodesg];
      }
      local_c28 = (REF_INT)(local_c20 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_c38 = -1;
      }
      else {
        local_c38 = ref_node_00->global[nnodesg];
      }
      local_c28 = (int)((local_c38 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[nnodesg] = local_c28;
    uVar2 = ref_node_add(ref_node_00,0xd,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x87a,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    dVar3 = cos(5.759586531581282);
    ref_node_00->real[cell * 0xf] = dVar3 * 0.25 + 0.5;
    dVar3 = sin(5.759586531581282);
    ref_node_00->real[cell * 0xf + 1] = dVar3 * 0.25 + 0.5;
    ref_node_00->real[cell * 0xf + 2] = 0.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_c88 = -1;
    }
    else {
      local_c88 = ref_node_00->global[cell];
    }
    if (local_c88 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_ca8 = -1;
      }
      else {
        local_ca8 = ref_node_00->global[cell];
      }
      local_cb0 = (REF_INT)(local_ca8 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_cc0 = -1;
      }
      else {
        local_cc0 = ref_node_00->global[cell];
      }
      local_cb0 = (int)((local_cc0 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[cell] = local_cb0;
    uVar2 = ref_node_add(ref_node_00,0xe,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x87c,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    dVar3 = cos(5.2359877559829835);
    ref_node_00->real[local[0] * 0xf] = dVar3 * 0.25 + 0.5;
    dVar3 = sin(5.2359877559829835);
    ref_node_00->real[local[0] * 0xf + 1] = dVar3 * 0.25 + 0.5;
    ref_node_00->real[local[0] * 0xf + 2] = 0.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_d10 = -1;
    }
    else {
      local_d10 = ref_node_00->global[local[0]];
    }
    if (local_d10 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_d30 = -1;
      }
      else {
        local_d30 = ref_node_00->global[local[0]];
      }
      local_d38 = (REF_INT)(local_d30 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_d48 = -1;
      }
      else {
        local_d48 = ref_node_00->global[local[0]];
      }
      local_d38 = (int)((local_d48 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_d38;
    uVar2 = ref_node_add(ref_node_00,0xf,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x87e,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    dVar3 = cos(4.712388980384685);
    ref_node_00->real[local[1] * 0xf] = dVar3 * 0.25 + 0.5;
    dVar3 = sin(4.712388980384685);
    ref_node_00->real[local[1] * 0xf + 1] = dVar3 * 0.25 + 0.5;
    ref_node_00->real[local[1] * 0xf + 2] = 0.0;
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_d98 = -1;
    }
    else {
      local_d98 = ref_node_00->global[local[1]];
    }
    if (local_d98 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_db8 = -1;
      }
      else {
        local_db8 = ref_node_00->global[local[1]];
      }
      local_dc0 = (REF_INT)(local_db8 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_dd0 = -1;
      }
      else {
        local_dd0 = ref_node_00->global[local[1]];
      }
      local_dc0 = (int)((local_dd0 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[1]] = local_dc0;
    uVar2 = ref_cell_add(pRVar1->cell[2],&nnodesg,(REF_INT *)((long)&x0 + 4));
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x880,"ref_fixture_twod_square_circle",(ulong)uVar2,"add tri");
      return uVar2;
    }
  }
  else {
    if (0xd / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_b64 = 0xd / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_b64 = (0xd - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                         ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((x0._0_4_ + -1) / ref_mpi->n) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_b64) goto LAB_0014a4ce;
    if (0xe / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_b90 = 0xe / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_b90 = (0xe - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                         ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((x0._0_4_ + -1) / ref_mpi->n) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_b90) goto LAB_0014a4ce;
    if (0xf / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_bbc = 0xf / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_bbc = (0xf - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                         ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((x0._0_4_ + -1) / ref_mpi->n) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_bbc) goto LAB_0014a4ce;
  }
  local[0x1a] = 0xf;
  local[2] = 6;
  if (0xf / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
      x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
    local_e08 = 0xf / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_e08 = (0xf - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                       ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) / ((x0._0_4_ + -1) / ref_mpi->n)
                + (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
  }
  if (ref_mpi->id == local_e08) {
LAB_0014bbe2:
    uVar2 = ref_node_add(ref_node_00,0xf,&nnodesg);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x891,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    dVar3 = cos(4.712388980384685);
    ref_node_00->real[nnodesg * 0xf] = dVar3 * 0.25 + 0.5;
    dVar3 = sin(4.712388980384685);
    ref_node_00->real[nnodesg * 0xf + 1] = dVar3 * 0.25 + 0.5;
    ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_ed0 = -1;
    }
    else {
      local_ed0 = ref_node_00->global[nnodesg];
    }
    if (local_ed0 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_ef0 = -1;
      }
      else {
        local_ef0 = ref_node_00->global[nnodesg];
      }
      local_ef8 = (REF_INT)(local_ef0 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_f08 = -1;
      }
      else {
        local_f08 = ref_node_00->global[nnodesg];
      }
      local_ef8 = (int)((local_f08 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[nnodesg] = local_ef8;
    uVar2 = ref_node_add(ref_node_00,0x10,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x893,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    dVar3 = cos(4.188790204786386);
    ref_node_00->real[cell * 0xf] = dVar3 * 0.25 + 0.5;
    dVar3 = sin(4.188790204786386);
    ref_node_00->real[cell * 0xf + 1] = dVar3 * 0.25 + 0.5;
    ref_node_00->real[cell * 0xf + 2] = 0.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_f58 = -1;
    }
    else {
      local_f58 = ref_node_00->global[cell];
    }
    if (local_f58 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_f78 = -1;
      }
      else {
        local_f78 = ref_node_00->global[cell];
      }
      local_f80 = (REF_INT)(local_f78 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_f90 = -1;
      }
      else {
        local_f90 = ref_node_00->global[cell];
      }
      local_f80 = (int)((local_f90 -
                        (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                        ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[cell] = local_f80;
    uVar2 = ref_node_add(ref_node_00,0x11,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x895,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    dVar3 = cos(3.6651914291880887);
    ref_node_00->real[local[0] * 0xf] = dVar3 * 0.25 + 0.5;
    dVar3 = sin(3.6651914291880887);
    ref_node_00->real[local[0] * 0xf + 1] = dVar3 * 0.25 + 0.5;
    ref_node_00->real[local[0] * 0xf + 2] = 0.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_fe0 = -1;
    }
    else {
      local_fe0 = ref_node_00->global[local[0]];
    }
    if (local_fe0 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_1000 = -1;
      }
      else {
        local_1000 = ref_node_00->global[local[0]];
      }
      local_1008 = (REF_INT)(local_1000 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_1018 = -1;
      }
      else {
        local_1018 = ref_node_00->global[local[0]];
      }
      local_1008 = (int)((local_1018 -
                         (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                         ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                        (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                   (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_1008;
    uVar2 = ref_node_add(ref_node_00,0x12,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x897,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    dVar3 = cos(3.14159265358979);
    ref_node_00->real[local[1] * 0xf] = dVar3 * 0.25 + 0.5;
    dVar3 = sin(3.14159265358979);
    ref_node_00->real[local[1] * 0xf + 1] = dVar3 * 0.25 + 0.5;
    ref_node_00->real[local[1] * 0xf + 2] = 0.0;
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_1068 = -1;
    }
    else {
      local_1068 = ref_node_00->global[local[1]];
    }
    if (local_1068 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_1088 = -1;
      }
      else {
        local_1088 = ref_node_00->global[local[1]];
      }
      local_1090 = (REF_INT)(local_1088 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_10a0 = -1;
      }
      else {
        local_10a0 = ref_node_00->global[local[1]];
      }
      local_1090 = (int)((local_10a0 -
                         (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                         ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                        (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                   (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[1]] = local_1090;
    uVar2 = ref_cell_add(pRVar1->cell[2],&nnodesg,(REF_INT *)((long)&x0 + 4));
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x899,"ref_fixture_twod_square_circle",(ulong)uVar2,"add tri");
      return uVar2;
    }
  }
  else {
    if (0x10 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_e34 = 0x10 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_e34 = (0x10 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                          ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((x0._0_4_ + -1) / ref_mpi->n) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_e34) goto LAB_0014bbe2;
    if (0x11 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_e60 = 0x11 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_e60 = (0x11 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                          ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((x0._0_4_ + -1) / ref_mpi->n) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_e60) goto LAB_0014bbe2;
    if (0x12 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_e8c = 0x12 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_e8c = (0x12 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                          ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                  ((x0._0_4_ + -1) / ref_mpi->n) +
                  (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_e8c) goto LAB_0014bbe2;
  }
  local[0x1a] = 0x12;
  local[2] = 7;
  if (0x12 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
      x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
    local_10d8 = 0x12 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_10d8 = (0x12 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                         ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                 ((x0._0_4_ + -1) / ref_mpi->n) +
                 (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
  }
  if (ref_mpi->id == local_10d8) {
LAB_0014d2f6:
    uVar2 = ref_node_add(ref_node_00,0x12,&nnodesg);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x8aa,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    dVar3 = cos(3.14159265358979);
    ref_node_00->real[nnodesg * 0xf] = dVar3 * 0.25 + 0.5;
    dVar3 = sin(3.14159265358979);
    ref_node_00->real[nnodesg * 0xf + 1] = dVar3 * 0.25 + 0.5;
    ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_11a0 = -1;
    }
    else {
      local_11a0 = ref_node_00->global[nnodesg];
    }
    if (local_11a0 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_11c0 = -1;
      }
      else {
        local_11c0 = ref_node_00->global[nnodesg];
      }
      local_11c8 = (REF_INT)(local_11c0 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
        local_11d8 = -1;
      }
      else {
        local_11d8 = ref_node_00->global[nnodesg];
      }
      local_11c8 = (int)((local_11d8 -
                         (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                         ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                        (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                   (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[nnodesg] = local_11c8;
    uVar2 = ref_node_add(ref_node_00,0x13,&cell);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x8ac,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    dVar3 = cos(2.6179938779914917);
    ref_node_00->real[cell * 0xf] = dVar3 * 0.25 + 0.5;
    dVar3 = sin(2.6179938779914917);
    ref_node_00->real[cell * 0xf + 1] = dVar3 * 0.25 + 0.5;
    ref_node_00->real[cell * 0xf + 2] = 0.0;
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_1228 = -1;
    }
    else {
      local_1228 = ref_node_00->global[cell];
    }
    if (local_1228 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_1248 = -1;
      }
      else {
        local_1248 = ref_node_00->global[cell];
      }
      local_1250 = (REF_INT)(local_1248 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
        local_1260 = -1;
      }
      else {
        local_1260 = ref_node_00->global[cell];
      }
      local_1250 = (int)((local_1260 -
                         (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                         ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                        (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                   (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[cell] = local_1250;
    uVar2 = ref_node_add(ref_node_00,0x14,local);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x8ae,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    dVar3 = cos(2.094395102393193);
    ref_node_00->real[local[0] * 0xf] = dVar3 * 0.25 + 0.5;
    dVar3 = sin(2.094395102393193);
    ref_node_00->real[local[0] * 0xf + 1] = dVar3 * 0.25 + 0.5;
    ref_node_00->real[local[0] * 0xf + 2] = 0.0;
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_12b0 = -1;
    }
    else {
      local_12b0 = ref_node_00->global[local[0]];
    }
    if (local_12b0 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_12d0 = -1;
      }
      else {
        local_12d0 = ref_node_00->global[local[0]];
      }
      local_12d8 = (REF_INT)(local_12d0 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0))
      {
        local_12e8 = -1;
      }
      else {
        local_12e8 = ref_node_00->global[local[0]];
      }
      local_12d8 = (int)((local_12e8 -
                         (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                         ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                        (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                   (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[0]] = local_12d8;
    uVar2 = ref_node_add(ref_node_00,0x15,local + 1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x8b0,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
      return uVar2;
    }
    dVar3 = cos(1.570796326794895);
    ref_node_00->real[local[1] * 0xf] = dVar3 * 0.25 + 0.5;
    dVar3 = sin(1.570796326794895);
    ref_node_00->real[local[1] * 0xf + 1] = dVar3 * 0.25 + 0.5;
    ref_node_00->real[local[1] * 0xf + 2] = 0.0;
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_1338 = -1;
    }
    else {
      local_1338 = ref_node_00->global[local[1]];
    }
    if (local_1338 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_1358 = -1;
      }
      else {
        local_1358 = ref_node_00->global[local[1]];
      }
      local_1360 = (REF_INT)(local_1358 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
    }
    else {
      if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0))
      {
        local_1370 = -1;
      }
      else {
        local_1370 = ref_node_00->global[local[1]];
      }
      local_1360 = (int)((local_1370 -
                         (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                         ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                        (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                   (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    ref_node_00->part[local[1]] = local_1360;
    uVar2 = ref_cell_add(pRVar1->cell[2],&nnodesg,(REF_INT *)((long)&x0 + 4));
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x8b2,"ref_fixture_twod_square_circle",(ulong)uVar2,"add tri");
      return uVar2;
    }
  }
  else {
    if (0x13 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_1104 = 0x13 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_1104 = (0x13 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                           ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                   ((x0._0_4_ + -1) / ref_mpi->n) +
                   (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_1104) goto LAB_0014d2f6;
    if (0x14 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_1130 = 0x14 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_1130 = (0x14 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                           ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                   ((x0._0_4_ + -1) / ref_mpi->n) +
                   (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_1130) goto LAB_0014d2f6;
    if (0x15 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_115c = 0x15 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_115c = (0x15 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                           ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                   ((x0._0_4_ + -1) / ref_mpi->n) +
                   (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id == local_115c) goto LAB_0014d2f6;
  }
  local[0x1a] = 0x15;
  local[2] = 8;
  if (0x15 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
      x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
    local_13a8 = 0x15 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
  }
  else {
    local_13a8 = (0x15 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                         ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                 ((x0._0_4_ + -1) / ref_mpi->n) +
                 (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
  }
  if (ref_mpi->id != local_13a8) {
    if (0x16 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
        x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
      local_13d4 = 0x16 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
    }
    else {
      local_13d4 = (0x16 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                           ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                   ((x0._0_4_ + -1) / ref_mpi->n) +
                   (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
    }
    if (ref_mpi->id != local_13d4) {
      if (0x17 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
          x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
        local_1400 = 0x17 / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
      }
      else {
        local_1400 = (0x17 - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                             ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                     ((x0._0_4_ + -1) / ref_mpi->n) +
                     (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
      }
      if (ref_mpi->id != local_1400) {
        if (0xc / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
            x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) {
          local_142c = 0xc / ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n);
        }
        else {
          local_142c = (0xc - (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                              ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                       ((x0._0_4_ + -1) / ref_mpi->n) +
                       (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
        }
        if (ref_mpi->id != local_142c) goto LAB_0014fac8;
      }
    }
  }
  uVar2 = ref_node_add(ref_node_00,0x15,&nnodesg);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x8c3
           ,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
    return uVar2;
  }
  dVar3 = cos(1.570796326794895);
  ref_node_00->real[nnodesg * 0xf] = dVar3 * 0.25 + 0.5;
  dVar3 = sin(1.570796326794895);
  ref_node_00->real[nnodesg * 0xf + 1] = dVar3 * 0.25 + 0.5;
  ref_node_00->real[nnodesg * 0xf + 2] = 0.0;
  if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
    local_1470 = -1;
  }
  else {
    local_1470 = ref_node_00->global[nnodesg];
  }
  if (local_1470 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_1490 = -1;
    }
    else {
      local_1490 = ref_node_00->global[nnodesg];
    }
    local_1498 = (REF_INT)(local_1490 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((nnodesg < 0) || (ref_node_00->max <= nnodesg)) || (ref_node_00->global[nnodesg] < 0)) {
      local_14a8 = -1;
    }
    else {
      local_14a8 = ref_node_00->global[nnodesg];
    }
    local_1498 = (int)((local_14a8 -
                       (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                       ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                      (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                 (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
  }
  ref_node_00->part[nnodesg] = local_1498;
  uVar2 = ref_node_add(ref_node_00,0x16,&cell);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x8c5
           ,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
    return uVar2;
  }
  dVar3 = cos(1.0471975511965965);
  ref_node_00->real[cell * 0xf] = dVar3 * 0.25 + 0.5;
  dVar3 = sin(1.0471975511965965);
  ref_node_00->real[cell * 0xf + 1] = dVar3 * 0.25 + 0.5;
  ref_node_00->real[cell * 0xf + 2] = 0.0;
  if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
    local_14f8 = -1;
  }
  else {
    local_14f8 = ref_node_00->global[cell];
  }
  if (local_14f8 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_1518 = -1;
    }
    else {
      local_1518 = ref_node_00->global[cell];
    }
    local_1520 = (REF_INT)(local_1518 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((cell < 0) || (ref_node_00->max <= cell)) || (ref_node_00->global[cell] < 0)) {
      local_1530 = -1;
    }
    else {
      local_1530 = ref_node_00->global[cell];
    }
    local_1520 = (int)((local_1530 -
                       (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                       ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                      (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                 (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
  }
  ref_node_00->part[cell] = local_1520;
  uVar2 = ref_node_add(ref_node_00,0x17,local);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x8c7
           ,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
    return uVar2;
  }
  dVar3 = cos(0.5235987755982983);
  ref_node_00->real[local[0] * 0xf] = dVar3 * 0.25 + 0.5;
  dVar3 = sin(0.5235987755982983);
  ref_node_00->real[local[0] * 0xf + 1] = dVar3 * 0.25 + 0.5;
  ref_node_00->real[local[0] * 0xf + 2] = 0.0;
  if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
    local_1580 = -1;
  }
  else {
    local_1580 = ref_node_00->global[local[0]];
  }
  if (local_1580 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_15a0 = -1;
    }
    else {
      local_15a0 = ref_node_00->global[local[0]];
    }
    local_15a8 = (REF_INT)(local_15a0 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((local[0] < 0) || (ref_node_00->max <= local[0])) || (ref_node_00->global[local[0]] < 0)) {
      local_15b8 = -1;
    }
    else {
      local_15b8 = ref_node_00->global[local[0]];
    }
    local_15a8 = (int)((local_15b8 -
                       (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                       ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                      (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                 (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
  }
  ref_node_00->part[local[0]] = local_15a8;
  uVar2 = ref_node_add(ref_node_00,0xc,local + 1);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x8c9
           ,"ref_fixture_twod_square_circle",(ulong)uVar2,"add node");
    return uVar2;
  }
  dVar3 = cos(0.0);
  ref_node_00->real[local[1] * 0xf] = dVar3 * 0.25 + 0.5;
  dVar3 = sin(0.0);
  ref_node_00->real[local[1] * 0xf + 1] = dVar3 * 0.25 + 0.5;
  ref_node_00->real[local[1] * 0xf + 2] = 0.0;
  if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
    local_1608 = -1;
  }
  else {
    local_1608 = ref_node_00->global[local[1]];
  }
  if (local_1608 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n) <
      (long)(x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n))) {
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_1628 = -1;
    }
    else {
      local_1628 = ref_node_00->global[local[1]];
    }
    local_1630 = (REF_INT)(local_1628 / (long)((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n));
  }
  else {
    if (((local[1] < 0) || (ref_node_00->max <= local[1])) || (ref_node_00->global[local[1]] < 0)) {
      local_1640 = -1;
    }
    else {
      local_1640 = ref_node_00->global[local[1]];
    }
    local_1630 = (int)((local_1640 -
                       (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n)) *
                       ((x0._0_4_ + ref_mpi->n + -1) / ref_mpi->n)) /
                      (long)((x0._0_4_ + -1) / ref_mpi->n)) +
                 (x0._0_4_ - ref_mpi->n * ((x0._0_4_ + -1) / ref_mpi->n));
  }
  ref_node_00->part[local[1]] = local_1630;
  uVar2 = ref_cell_add(pRVar1->cell[2],&nnodesg,(REF_INT *)((long)&x0 + 4));
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x8cb
           ,"ref_fixture_twod_square_circle",(ulong)uVar2,"add tri");
    return uVar2;
  }
LAB_0014fac8:
  ref_grid_ptr_local._4_4_ = ref_node_initialize_n_global(ref_node_00,(long)x0._0_4_);
  if (ref_grid_ptr_local._4_4_ == 0) {
    ref_grid_ptr_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x8ce
           ,"ref_fixture_twod_square_circle",(ulong)ref_grid_ptr_local._4_4_,"init glob");
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_twod_square_circle(REF_GRID *ref_grid_ptr,
                                                  REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 24;
  REF_DBL x0 = 0.5, y0 = 0.5, r = 0.25, t;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  local[4] = 1;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0 / 3.0, 0.0, 0.0);
    add_that_node(2, 2.0 / 3.0, 0.0, 0.0);
    add_that_node(3, 1.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 3;
  global[1] = 4;
  global[2] = 5;
  global[3] = 6;
  local[4] = 2;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 1.0, 0.0, 0.0);
    add_that_node(1, 1.0, 1.0 / 3.0, 0.0);
    add_that_node(2, 1.0, 2.0 / 3.0, 0.0);
    add_that_node(3, 1.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 6;
  global[1] = 7;
  global[2] = 8;
  global[3] = 9;
  local[4] = 3;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 1.0, 1.0, 0.0);
    add_that_node(1, 2.0 / 3.0, 1.0, 0.0);
    add_that_node(2, 1.0 / 3.0, 1.0, 0.0);
    add_that_node(3, 0.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 9;
  global[1] = 10;
  global[2] = 11;
  global[3] = 0;
  local[4] = 4;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 1.0, 0.0);
    add_that_node(1, 0.0, 2.0 / 3.0, 0.0);
    add_that_node(2, 0.0, 1.0 / 3.0, 0.0);
    add_that_node(3, 0.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 12;
  global[1] = 13;
  global[2] = 14;
  global[3] = 15;
  local[4] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (12.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (11.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (10.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (9.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 15;
  global[1] = 16;
  global[2] = 17;
  global[3] = 18;
  local[4] = 6;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (9.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (8.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (7.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (6.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 18;
  global[1] = 19;
  global[2] = 20;
  global[3] = 21;
  local[4] = 7;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (6.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (5.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (4.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (3.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 21;
  global[1] = 22;
  global[2] = 23;
  global[3] = 12;
  local[4] = 8;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (3.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (2.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (1.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (0.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}